

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O3

Aig_Obj_t * Aig_Exor(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  
  if (p0 == p1) {
    pAVar2 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
  }
  else if ((Aig_Obj_t *)((ulong)p1 ^ 1) == p0) {
    pAVar2 = p->pConst1;
  }
  else {
    pAVar3 = (Aig_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
    pAVar2 = p->pConst1;
    if (pAVar2 == pAVar3) {
      pAVar2 = (Aig_Obj_t *)((ulong)(pAVar3 == p0) ^ (ulong)p1);
    }
    else {
      pAVar1 = (Aig_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
      if (pAVar2 == pAVar1) {
        pAVar2 = (Aig_Obj_t *)((ulong)(pAVar2 == p1) ^ (ulong)p0);
      }
      else {
        if (p->fCatchExor == 0) {
          pAVar2 = Aig_And(p,p0,(Aig_Obj_t *)((ulong)p1 ^ 1));
          pAVar3 = Aig_And(p,(Aig_Obj_t *)((ulong)p0 ^ 1),p1);
          pAVar2 = Aig_Or(p,pAVar2,pAVar3);
          return pAVar2;
        }
        pAVar2 = pAVar1;
        if (pAVar1 == (Aig_Obj_t *)0x0) {
          if (pAVar3 == (Aig_Obj_t *)0x0) goto LAB_006ca402;
          *(ulong *)&(p->Ghost).field_0x18 =
               *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 6;
        }
        else {
          if ((*(uint *)&pAVar1->field_0x18 & 7) == 1) {
            __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x15e,
                          "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                         );
          }
          if (pAVar3 == pAVar1) {
LAB_006ca402:
            __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x15f,
                          "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                         );
          }
          *(ulong *)&(p->Ghost).field_0x18 =
               *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 6;
          if (pAVar1->Id <= pAVar3->Id) {
            pAVar2 = pAVar3;
            pAVar3 = pAVar1;
          }
        }
        (p->Ghost).pFanin0 = pAVar3;
        (p->Ghost).pFanin1 = pAVar2;
        pAVar2 = Aig_TableLookup(p,&p->Ghost);
        if (pAVar2 == (Aig_Obj_t *)0x0) {
          pAVar2 = Aig_ObjCreate(p,&p->Ghost);
        }
        pAVar2 = (Aig_Obj_t *)((ulong)(((uint)p1 ^ (uint)p0) & 1) ^ (ulong)pAVar2);
      }
    }
  }
  return pAVar2;
}

Assistant:

Aig_Obj_t * Aig_Exor( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    Aig_Obj_t * pGhost, * pResult;
    int fCompl;
    // check trivial cases
    if ( p0 == p1 )
        return Aig_Not(p->pConst1);
    if ( p0 == Aig_Not(p1) )
        return p->pConst1;
    if ( Aig_Regular(p0) == p->pConst1 )
        return Aig_NotCond( p1, p0 == p->pConst1 );
    if ( Aig_Regular(p1) == p->pConst1 )
        return Aig_NotCond( p0, p1 == p->pConst1 );
    // when there is no special XOR gates
    if ( !p->fCatchExor )
        return Aig_Or( p, Aig_And(p, p0, Aig_Not(p1)), Aig_And(p, Aig_Not(p0), p1) );
    // canonicize
    fCompl = Aig_IsComplement(p0) ^ Aig_IsComplement(p1);
    p0 = Aig_Regular(p0);
    p1 = Aig_Regular(p1);
    pGhost = Aig_ObjCreateGhost( p, p0, p1, AIG_OBJ_EXOR );
    // check the table
    if ( (pResult = Aig_TableLookup( p, pGhost )) )
        return Aig_NotCond( pResult, fCompl );
    pResult = Aig_ObjCreate( p, pGhost );
    return Aig_NotCond( pResult, fCompl );
}